

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O1

bool __thiscall CEditor::PopupSelectImage(CEditor *this,void *pContext,CUIRect View)

{
  undefined4 uVar1;
  CEditorImage *pCVar2;
  undefined4 uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  char *pText;
  uint uVar9;
  int *pID;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  CUIRect Button;
  CUIRect ButtonBar;
  long local_80;
  CUIRect local_78;
  CUIRect local_68;
  CUIRect local_58;
  CUIRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = View;
  CUIRect::VSplitLeft(&local_48,80.0,&local_58,&local_48);
  CUIRect::Margin(&local_48,10.0,&local_68);
  iVar6 = (this->m_Map).m_lImages.num_elements;
  uVar8 = g_SelectImageCurrent;
  if (iVar6 < 0) {
    bVar7 = 0;
  }
  else {
    lVar10 = -1;
    uVar9 = 0xffffffff;
    lVar11 = -8;
    local_80 = 0;
    bVar7 = 0;
    do {
      CUIRect::HSplitTop(&local_58,12.0,&local_78,&local_58);
      CUIRect::HSplitTop(&local_58,2.0,(CUIRect *)0x0,&local_58);
      bVar5 = CUIRect::Inside(&local_78,(this->m_UI).m_MouseX,(this->m_UI).m_MouseY);
      uVar4 = uVar9;
      if (!bVar5) {
        uVar4 = uVar8;
      }
      uVar8 = uVar4;
      pID = &PopupSelectImage::s_NoImageButton;
      if (local_80 != 0) {
        pID = (int *)((long)(this->m_Map).m_lImages.list + lVar11);
      }
      pText = "None";
      bVar5 = local_80 != 0;
      local_80 = local_80 + -1;
      if (bVar5) {
        pText = (char *)(*(long *)((long)(this->m_Map).m_lImages.list + lVar11) + 0x28);
      }
      iVar6 = DoButton_MenuItem(this,pID,pText,(uint)(uVar9 == g_SelectImageCurrent),&local_78,0,
                                (char *)0x0);
      if (iVar6 != 0) {
        g_SelectImageSelected = uVar9;
        iVar6 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[0xb])();
        bVar7 = bVar7 | (byte)iVar6;
      }
      lVar10 = lVar10 + 1;
      iVar6 = (this->m_Map).m_lImages.num_elements;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar10 < iVar6);
  }
  if (-1 < (int)uVar8 && (int)uVar8 < iVar6) {
    if (local_68.w <= local_68.h) {
      local_68.h = local_68.w;
    }
    pCVar2 = (this->m_Map).m_lImages.list[uVar8];
    uVar1 = (pCVar2->super_CImageInfo).m_Width;
    uVar3 = (pCVar2->super_CImageInfo).m_Height;
    iVar6 = uVar3;
    if ((int)uVar3 < (int)uVar1) {
      iVar6 = uVar1;
    }
    auVar12._0_4_ = (float)(int)uVar1;
    auVar12._4_4_ = (float)(int)uVar3;
    auVar12._8_8_ = 0;
    auVar13._4_4_ = (float)iVar6;
    auVar13._0_4_ = (float)iVar6;
    auVar13._8_8_ = 0;
    auVar13 = divps(auVar12,auVar13);
    fVar14 = local_68.h * auVar13._0_4_;
    local_68.h = local_68.h * auVar13._4_4_;
    local_68.w = fVar14;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (this->m_pGraphics,(ulong)(uint)(pCVar2->m_Texture).m_Id);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0xb])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
    local_78.x = local_68.x;
    local_78.y = local_68.y;
    local_78.w = local_68.w;
    local_78.h = local_68.h;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(this->m_pGraphics,&local_78,1);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[10])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool CEditor::PopupSelectImage(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CUIRect ButtonBar, ImageView;
	View.VSplitLeft(80.0f, &ButtonBar, &View);
	View.Margin(10.0f, &ImageView);

	int ShowImage = g_SelectImageCurrent;
	bool ClosePopup = false;

	static int s_NoImageButton;
	for(int i = -1; i < pEditor->m_Map.m_lImages.size(); i++)
	{
		CUIRect Button;
		ButtonBar.HSplitTop(12.0f, &Button, &ButtonBar);
		ButtonBar.HSplitTop(2.0f, 0, &ButtonBar);

		if(pEditor->UI()->MouseInside(&Button))
			ShowImage = i;

		if(pEditor->DoButton_MenuItem(i == -1 ? (void *)&s_NoImageButton : &pEditor->m_Map.m_lImages[i], i == -1 ? "None" : pEditor->m_Map.m_lImages[i]->m_aName, i == g_SelectImageCurrent, &Button))
		{
			g_SelectImageSelected = i;
			ClosePopup |= pEditor->Input()->MouseDoubleClick();
		}
	}

	if(ShowImage >= 0 && ShowImage < pEditor->m_Map.m_lImages.size())
	{
		if(ImageView.h < ImageView.w)
			ImageView.w = ImageView.h;
		else
			ImageView.h = ImageView.w;
		float Max = (float)(maximum(pEditor->m_Map.m_lImages[ShowImage]->m_Width, pEditor->m_Map.m_lImages[ShowImage]->m_Height));
		ImageView.w *= pEditor->m_Map.m_lImages[ShowImage]->m_Width/Max;
		ImageView.h *= pEditor->m_Map.m_lImages[ShowImage]->m_Height/Max;
		pEditor->Graphics()->TextureSet(pEditor->m_Map.m_lImages[ShowImage]->m_Texture);
		pEditor->Graphics()->BlendNormal();
		pEditor->Graphics()->WrapClamp();
		pEditor->Graphics()->QuadsBegin();
		IGraphics::CQuadItem QuadItem(ImageView.x, ImageView.y, ImageView.w, ImageView.h);
		pEditor->Graphics()->QuadsDrawTL(&QuadItem, 1);
		pEditor->Graphics()->QuadsEnd();
		pEditor->Graphics()->WrapNormal();
	}

	return ClosePopup;
}